

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O3

int duckdb::Terminal::HasMoreData(int fd)

{
  int iVar1;
  fd_set rfds;
  timeval local_98;
  fd_set local_88;
  
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[0] = 0;
  local_88.fds_bits[1] = 0;
  iVar1 = fd + 0x3f;
  if (-1 < fd) {
    iVar1 = fd;
  }
  local_88.fds_bits[iVar1 >> 6] = local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)(fd % 0x40) & 0x3f);
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  iVar1 = select(1,&local_88,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return iVar1;
}

Assistant:

int Terminal::HasMoreData(int fd) {
	fd_set rfds;
	FD_ZERO(&rfds);
	FD_SET(fd, &rfds);

	// no timeout: return immediately
	struct timeval tv;
	tv.tv_sec = 0;
	tv.tv_usec = 0;
	return select(1, &rfds, NULL, NULL, &tv);
}